

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

uint32_t __thiscall TldDSAsKey::Hash(TldDSAsKey *this)

{
  uint32_t uVar1;
  size_t sVar2;
  
  if (this->hash == 0) {
    uVar1 = 0xc001cafe;
    if (this->name_len != 0) {
      sVar2 = 0;
      do {
        uVar1 = (uint)this->name[sVar2] + uVar1 * 0x65;
        sVar2 = sVar2 + 1;
      } while (this->name_len != sVar2);
    }
    this->hash = uVar1;
  }
  return this->hash;
}

Assistant:

uint32_t TldDSAsKey::Hash()
{
    if (hash == 0)
    {
        uint32_t x = 0xC001CAFE;

        for (size_t i = 0; i < name_len; i++)
        {
            x = (x * 101) + name[i];
        }

        hash = x;
    }

    return hash;
}